

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linmath.h
# Opt level: O1

void mat4x4_look_at(vec4 *m,float *eye,float *center,float *up)

{
  int i;
  long lVar1;
  float *pfVar2;
  long lVar3;
  float p;
  float fVar4;
  vec3 s;
  vec3 f;
  vec4 t;
  vec4 r;
  float local_b0 [6];
  float local_98 [5];
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  float afStack_28 [4];
  
  lVar1 = 0;
  do {
    local_b0[lVar1 + 3] = center[lVar1] - eye[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar4 = 0.0;
  lVar1 = 0;
  do {
    fVar4 = fVar4 + local_b0[lVar1 + 3] * local_b0[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  lVar1 = 0;
  do {
    local_b0[lVar1 + 3] = local_b0[lVar1 + 3] * (1.0 / fVar4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_38 = -local_b0[5];
  local_b0[0] = local_b0[4] * up[2] - up[1] * local_b0[5];
  local_78 = -local_b0[3];
  local_b0[1] = local_b0[5] * *up - up[2] * local_b0[3];
  local_98[4] = -local_b0[4];
  local_b0[2] = up[1] * local_b0[3] - *up * local_b0[4];
  fVar4 = 0.0;
  lVar1 = 0;
  do {
    fVar4 = fVar4 + local_b0[lVar1] * local_b0[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  if (fVar4 < 0.0) {
    uStack_34 = 0x80000000;
    uStack_30 = 0x80000000;
    uStack_2c = 0x80000000;
    local_48 = ZEXT416((uint)local_b0[3]);
    local_58 = ZEXT416((uint)local_b0[4]);
    local_68 = ZEXT416((uint)local_b0[5]);
    uStack_74 = 0x80000000;
    uStack_70 = 0x80000000;
    uStack_6c = 0x80000000;
    uStack_84 = 0x80000000;
    uStack_80 = 0x80000000;
    uStack_7c = 0x80000000;
    fVar4 = sqrtf(fVar4);
    local_b0[4] = (float)local_58._0_4_;
    local_b0[3] = (float)local_48._0_4_;
    local_b0[5] = (float)local_68._0_4_;
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  lVar1 = 0;
  do {
    local_b0[lVar1] = local_b0[lVar1] * (1.0 / fVar4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (*m)[0] = local_b0[0];
  (*m)[1] = local_b0[1] * local_b0[5] - local_b0[4] * local_b0[2];
  (*m)[2] = local_78;
  lVar1 = 0;
  (*m)[3] = 0.0;
  m[1][0] = local_b0[1];
  m[1][1] = local_b0[2] * local_b0[3] - local_b0[5] * local_b0[0];
  m[1][2] = local_98[4];
  m[1][3] = 0.0;
  m[2][0] = local_b0[2];
  m[2][1] = local_b0[0] * local_b0[4] - local_b0[3] * local_b0[1];
  m[2][2] = local_38;
  *(undefined8 *)(m[2] + 3) = 0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  m[3][3] = 1.0;
  local_98[0] = -*eye;
  local_98[1] = -eye[1];
  local_98[2] = -eye[2];
  local_98[3] = 0.0;
  pfVar2 = *m;
  do {
    lVar3 = 0;
    do {
      *(float *)((long)afStack_28 + lVar3) = pfVar2[lVar3];
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x10);
    fVar4 = 0.0;
    lVar3 = 0;
    do {
      fVar4 = fVar4 + local_b0[lVar3 + 6] * afStack_28[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    m[3][lVar1] = fVar4 + m[3][lVar1];
    lVar1 = lVar1 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

static inline void mat4x4_look_at(mat4x4 m, vec3 eye, vec3 center, vec3 up)
{
	/* Adapted from Android's OpenGL Matrix.java.                        */
	/* See the OpenGL GLUT documentation for gluLookAt for a description */
	/* of the algorithm. We implement it in a straightforward way:       */

	/* TODO: The negation of of can be spared by swapping the order of
	 *       operands in the following cross products in the right way. */
	vec3 f;
	vec3_sub(f, center, eye);	
	vec3_norm(f, f);	
	
	vec3 s;
	vec3_mul_cross(s, f, up);
	vec3_norm(s, s);

	vec3 t;
	vec3_mul_cross(t, s, f);

	m[0][0] =  s[0];
	m[0][1] =  t[0];
	m[0][2] = -f[0];
	m[0][3] =   0.f;

	m[1][0] =  s[1];
	m[1][1] =  t[1];
	m[1][2] = -f[1];
	m[1][3] =   0.f;

	m[2][0] =  s[2];
	m[2][1] =  t[2];
	m[2][2] = -f[2];
	m[2][3] =   0.f;

	m[3][0] =  0.f;
	m[3][1] =  0.f;
	m[3][2] =  0.f;
	m[3][3] =  1.f;

	mat4x4_translate_in_place(m, -eye[0], -eye[1], -eye[2]);
}